

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int coda_XML_SetParamEntityParsing(XML_Parser parser,XML_ParamEntityParsing peParsing)

{
  XML_ParamEntityParsing peParsing_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (((parser->m_parsingStatus).parsing == XML_PARSING) ||
          ((parser->m_parsingStatus).parsing == XML_SUSPENDED)) {
    parser_local._4_4_ = 0;
  }
  else {
    parser->m_paramEntityParsing = peParsing;
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

int XMLCALL
XML_SetParamEntityParsing(XML_Parser parser,
                          enum XML_ParamEntityParsing peParsing) {
  if (parser == NULL)
    return 0;
  /* block after XML_Parse()/XML_ParseBuffer() has been called */
  if (parser->m_parsingStatus.parsing == XML_PARSING
      || parser->m_parsingStatus.parsing == XML_SUSPENDED)
    return 0;
#ifdef XML_DTD
  parser->m_paramEntityParsing = peParsing;
  return 1;
#else
  return peParsing == XML_PARAM_ENTITY_PARSING_NEVER;
#endif
}